

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int apply_pan_envelope(IT_PLAYING *playing)

{
  char cVar1;
  uint uVar2;
  long in_RDI;
  int p;
  int pan;
  int local_18;
  uint local_14;
  uint local_4;
  
  if (*(ushort *)(in_RDI + 0x46) < 0x4001) {
    if (*(char *)(in_RDI + 0x5b) == '\0') {
      local_14 = (uint)*(ushort *)(in_RDI + 0x46);
    }
    else {
      cVar1 = *(char *)(in_RDI + 0x5d);
      if (cVar1 == '\x01') {
        local_14 = (uint)"@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
                         [*(byte *)(in_RDI + 0x5c)];
      }
      else if (cVar1 == '\x02') {
        local_14 = (uint)"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
                         [*(byte *)(in_RDI + 0x5c)];
      }
      else if (cVar1 == '\x03') {
        local_14 = (uint)*(char *)(in_RDI + 0x5e);
      }
      else {
        local_14 = (uint)""[*(byte *)(in_RDI + 0x5c)];
      }
      local_14 = (uint)*(ushort *)(in_RDI + 0x46) + (uint)*(byte *)(in_RDI + 0x5b) * 8 * local_14;
      if ((int)local_14 < 0) {
        local_14 = 0;
      }
      else if (0x4000 < (int)local_14) {
        local_14 = 0x4000;
      }
    }
    if ((*(long *)(in_RDI + 0x20) != 0) && ((*(byte *)(in_RDI + 0x4b) & 2) != 0)) {
      local_18 = envelope_get_y((IT_ENVELOPE *)(*(long *)(in_RDI + 0x20) + 0x82),
                                (IT_PLAYING_ENVELOPE *)(in_RDI + 0x80));
      uVar2 = local_14;
      if (0x2000 < (int)local_14) {
        uVar2 = 0x4000 - local_14;
      }
      local_18 = uVar2 * local_18;
      local_14 = (local_18 >> 0xd) + local_14;
    }
    local_4 = local_14;
  }
  else {
    local_4 = (uint)*(ushort *)(in_RDI + 0x46);
  }
  return local_4;
}

Assistant:

static int apply_pan_envelope(IT_PLAYING *playing)
{
	if (playing->pan <= 64 << IT_ENVELOPE_SHIFT) {
		int pan;
		if (playing->panbrello_depth) {
			switch (playing->panbrello_waveform) {
			default:
				pan = it_sine[playing->panbrello_time];
				break;
			case 1:
				pan = it_sawtooth[playing->panbrello_time];
				break;
			case 2:
				pan = it_squarewave[playing->panbrello_time];
				break;
			case 3:
				pan = playing->panbrello_random;
				break;
			}
			pan *= playing->panbrello_depth << 3;

			pan += playing->pan;
			if (pan < 0) pan = 0;
			else if (pan > 64 << IT_ENVELOPE_SHIFT) pan = 64 << IT_ENVELOPE_SHIFT;
		} else {
			pan = playing->pan;
		}

		if (playing->env_instrument && (playing->enabled_envelopes & IT_ENV_PANNING)) {
			int p = envelope_get_y(&playing->env_instrument->pan_envelope, &playing->pan_envelope);
			if (pan > 32 << IT_ENVELOPE_SHIFT)
				p *= (64 << IT_ENVELOPE_SHIFT) - pan;
			else
				p *= pan;
			pan += p >> (5 + IT_ENVELOPE_SHIFT);
		}
		return pan;
	}
	return playing->pan;
}